

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
DistanceGraph::get_prev_nodes
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,DistanceGraph *this,
          sgNodeID_t n)

{
  pointer pvVar1;
  pointer pLVar2;
  iterator __position;
  long lVar3;
  Link *l;
  pointer pLVar4;
  long local_30;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = -n;
  if (0 < n) {
    lVar3 = n;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar4 = pvVar1[lVar3].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = *(pointer *)
            ((long)&pvVar1[lVar3].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (pLVar4 != pLVar2) {
    do {
      if (pLVar4->source == n) {
        local_30 = -pLVar4->dest;
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,__position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pLVar4 = pLVar4 + 1;
    } while (pLVar4 != pLVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sgNodeID_t> DistanceGraph::get_prev_nodes(sgNodeID_t n) const {
    std::vector<sgNodeID_t > r;
    for (auto&  l:links[llabs(n)]) if (l.source==n) r.emplace_back(-l.dest);
    return r;
}